

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O0

void sha1_step(sha1_ctxt *ctxt)

{
  int iVar1;
  ulong uVar2;
  sha1_ctxt tctxt;
  size_t s;
  size_t t;
  uint tmp;
  uint e;
  uint d;
  uint c;
  uint b;
  uint a;
  sha1_ctxt *ctxt_local;
  
  memcpy(&tctxt.c,&ctxt->m,0x40);
  (ctxt->m).b8[0] = tctxt.c.b8[3];
  (ctxt->m).b8[1] = tctxt.c.b8[2];
  (ctxt->m).b8[2] = tctxt.c.b8[1];
  (ctxt->m).b8[3] = tctxt.c.b8[0];
  (ctxt->m).b8[4] = tctxt.c.b8[7];
  (ctxt->m).b8[5] = tctxt.c.b8[6];
  (ctxt->m).b8[6] = tctxt.c.b8[5];
  (ctxt->m).b8[7] = tctxt.c.b8[4];
  (ctxt->m).b8[8] = tctxt.m.b8[3];
  (ctxt->m).b8[9] = tctxt.m.b8[2];
  (ctxt->m).b8[10] = tctxt.m.b8[1];
  (ctxt->m).b8[0xb] = tctxt.m.b8[0];
  (ctxt->m).b8[0xc] = tctxt.m.b8[7];
  (ctxt->m).b8[0xd] = tctxt.m.b8[6];
  (ctxt->m).b8[0xe] = tctxt.m.b8[5];
  (ctxt->m).b8[0xf] = tctxt.m.b8[4];
  (ctxt->m).b8[0x10] = tctxt.m.b8[0xb];
  (ctxt->m).b8[0x11] = tctxt.m.b8[10];
  (ctxt->m).b8[0x12] = tctxt.m.b8[9];
  (ctxt->m).b8[0x13] = tctxt.m.b8[8];
  (ctxt->m).b8[0x14] = tctxt.m.b8[0xf];
  (ctxt->m).b8[0x15] = tctxt.m.b8[0xe];
  (ctxt->m).b8[0x16] = tctxt.m.b8[0xd];
  (ctxt->m).b8[0x17] = tctxt.m.b8[0xc];
  (ctxt->m).b8[0x18] = tctxt.m.b8[0x13];
  (ctxt->m).b8[0x19] = tctxt.m.b8[0x12];
  (ctxt->m).b8[0x1a] = tctxt.m.b8[0x11];
  (ctxt->m).b8[0x1b] = tctxt.m.b8[0x10];
  (ctxt->m).b8[0x1c] = tctxt.m.b8[0x17];
  (ctxt->m).b8[0x1d] = tctxt.m.b8[0x16];
  (ctxt->m).b8[0x1e] = tctxt.m.b8[0x15];
  (ctxt->m).b8[0x1f] = tctxt.m.b8[0x14];
  (ctxt->m).b8[0x20] = tctxt.m.b8[0x1b];
  (ctxt->m).b8[0x21] = tctxt.m.b8[0x1a];
  (ctxt->m).b8[0x22] = tctxt.m.b8[0x19];
  (ctxt->m).b8[0x23] = tctxt.m.b8[0x18];
  (ctxt->m).b8[0x24] = tctxt.m.b8[0x1f];
  (ctxt->m).b8[0x25] = tctxt.m.b8[0x1e];
  (ctxt->m).b8[0x26] = tctxt.m.b8[0x1d];
  (ctxt->m).b8[0x27] = tctxt.m.b8[0x1c];
  (ctxt->m).b8[0x28] = tctxt.m.b8[0x23];
  (ctxt->m).b8[0x29] = tctxt.m.b8[0x22];
  (ctxt->m).b8[0x2a] = tctxt.m.b8[0x21];
  (ctxt->m).b8[0x2b] = tctxt.m.b8[0x20];
  (ctxt->m).b8[0x2c] = tctxt.m.b8[0x27];
  (ctxt->m).b8[0x2d] = tctxt.m.b8[0x26];
  (ctxt->m).b8[0x2e] = tctxt.m.b8[0x25];
  (ctxt->m).b8[0x2f] = tctxt.m.b8[0x24];
  (ctxt->m).b8[0x30] = tctxt.m.b8[0x2b];
  (ctxt->m).b8[0x31] = tctxt.m.b8[0x2a];
  (ctxt->m).b8[0x32] = tctxt.m.b8[0x29];
  (ctxt->m).b8[0x33] = tctxt.m.b8[0x28];
  (ctxt->m).b8[0x34] = tctxt.m.b8[0x2f];
  (ctxt->m).b8[0x35] = tctxt.m.b8[0x2e];
  (ctxt->m).b8[0x36] = tctxt.m.b8[0x2d];
  (ctxt->m).b8[0x37] = tctxt.m.b8[0x2c];
  (ctxt->m).b8[0x38] = tctxt.m.b8[0x33];
  (ctxt->m).b8[0x39] = tctxt.m.b8[0x32];
  (ctxt->m).b8[0x3a] = tctxt.m.b8[0x31];
  (ctxt->m).b8[0x3b] = tctxt.m.b8[0x30];
  (ctxt->m).b8[0x3c] = tctxt.m.b8[0x37];
  (ctxt->m).b8[0x3d] = tctxt.m.b8[0x36];
  (ctxt->m).b8[0x3e] = tctxt.m.b8[0x35];
  (ctxt->m).b8[0x3f] = tctxt.m.b8[0x34];
  d = (ctxt->h).b32[1];
  e = (ctxt->h).b32[2];
  tmp = (ctxt->h).b32[3];
  t._4_4_ = (ctxt->h).b32[4];
  c = (ctxt->h).b32[0];
  for (s = 0; s < 0x14; s = s + 1) {
    tctxt._96_8_ = s & 0xf;
    if (0xf < s) {
      *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4) =
           (*(uint *)((long)&ctxt->m + (tctxt._96_8_ + 0xd & 0xf) * 4) ^
            *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 8 & 0xf) * 4) ^
            *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 2 & 0xf) * 4) ^
           *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4)) << 1 |
           (*(uint *)((long)&ctxt->m + (tctxt._96_8_ + 0xd & 0xf) * 4) ^
            *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 8 & 0xf) * 4) ^
            *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 2 & 0xf) * 4) ^
           *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4)) >> 0x1f;
    }
    iVar1 = (c << 5 | c >> 0x1b) + (d & e | (d ^ 0xffffffff) & tmp) + t._4_4_;
    uVar2 = s / 0x14;
    t._4_4_ = tmp;
    tmp = e;
    e = d << 0x1e | d >> 2;
    d = c;
    c = iVar1 + *(int *)((long)&ctxt->m + tctxt._96_8_ * 4) + _K[uVar2];
  }
  for (s = 0x14; s < 0x28; s = s + 1) {
    tctxt._96_8_ = s & 0xf;
    *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4) =
         (*(uint *)((long)&ctxt->m + (tctxt._96_8_ + 0xd & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 8 & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 2 & 0xf) * 4) ^
         *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4)) << 1 |
         (*(uint *)((long)&ctxt->m + (tctxt._96_8_ + 0xd & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 8 & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 2 & 0xf) * 4) ^
         *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4)) >> 0x1f;
    iVar1 = (c << 5 | c >> 0x1b) + (d ^ e ^ tmp) + t._4_4_;
    uVar2 = s / 0x14;
    t._4_4_ = tmp;
    tmp = e;
    e = d << 0x1e | d >> 2;
    d = c;
    c = iVar1 + *(int *)((long)&ctxt->m + tctxt._96_8_ * 4) + _K[uVar2];
  }
  for (s = 0x28; s < 0x3c; s = s + 1) {
    tctxt._96_8_ = s & 0xf;
    *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4) =
         (*(uint *)((long)&ctxt->m + (tctxt._96_8_ + 0xd & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 8 & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 2 & 0xf) * 4) ^
         *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4)) << 1 |
         (*(uint *)((long)&ctxt->m + (tctxt._96_8_ + 0xd & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 8 & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 2 & 0xf) * 4) ^
         *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4)) >> 0x1f;
    iVar1 = (c << 5 | c >> 0x1b) + (d & (e | tmp) | e & tmp) + t._4_4_;
    uVar2 = s / 0x14;
    t._4_4_ = tmp;
    tmp = e;
    e = d << 0x1e | d >> 2;
    d = c;
    c = iVar1 + *(int *)((long)&ctxt->m + tctxt._96_8_ * 4) + _K[uVar2];
  }
  for (s = 0x3c; s < 0x50; s = s + 1) {
    tctxt._96_8_ = s & 0xf;
    *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4) =
         (*(uint *)((long)&ctxt->m + (tctxt._96_8_ + 0xd & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 8 & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 2 & 0xf) * 4) ^
         *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4)) << 1 |
         (*(uint *)((long)&ctxt->m + (tctxt._96_8_ + 0xd & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 8 & 0xf) * 4) ^
          *(uint *)((long)&ctxt->m + (tctxt._96_8_ + 2 & 0xf) * 4) ^
         *(uint *)((long)&ctxt->m + tctxt._96_8_ * 4)) >> 0x1f;
    iVar1 = (c << 5 | c >> 0x1b) + (d ^ e ^ tmp) + t._4_4_;
    uVar2 = s / 0x14;
    t._4_4_ = tmp;
    tmp = e;
    e = d << 0x1e | d >> 2;
    d = c;
    c = iVar1 + *(int *)((long)&ctxt->m + tctxt._96_8_ * 4) + _K[uVar2];
  }
  (ctxt->h).b32[0] = (ctxt->h).b32[0] + c;
  (ctxt->h).b32[1] = (ctxt->h).b32[1] + d;
  (ctxt->h).b32[2] = (ctxt->h).b32[2] + e;
  (ctxt->h).b32[3] = (ctxt->h).b32[3] + tmp;
  (ctxt->h).b32[4] = (ctxt->h).b32[4] + t._4_4_;
  memset(&ctxt->m,0,0x40);
  return;
}

Assistant:

static void
sha1_step(struct sha1_ctxt *ctxt)
{
	unsigned int	a, b, c, d, e, tmp;
	size_t t, s;

#if BYTE_ORDER == LITTLE_ENDIAN
	struct sha1_ctxt tctxt;

	memcpy(&tctxt.m.b8[0], &ctxt->m.b8[0], 64);
	ctxt->m.b8[0] = tctxt.m.b8[3]; ctxt->m.b8[1] = tctxt.m.b8[2];
	ctxt->m.b8[2] = tctxt.m.b8[1]; ctxt->m.b8[3] = tctxt.m.b8[0];
	ctxt->m.b8[4] = tctxt.m.b8[7]; ctxt->m.b8[5] = tctxt.m.b8[6];
	ctxt->m.b8[6] = tctxt.m.b8[5]; ctxt->m.b8[7] = tctxt.m.b8[4];
	ctxt->m.b8[8] = tctxt.m.b8[11]; ctxt->m.b8[9] = tctxt.m.b8[10];
	ctxt->m.b8[10] = tctxt.m.b8[9]; ctxt->m.b8[11] = tctxt.m.b8[8];
	ctxt->m.b8[12] = tctxt.m.b8[15]; ctxt->m.b8[13] = tctxt.m.b8[14];
	ctxt->m.b8[14] = tctxt.m.b8[13]; ctxt->m.b8[15] = tctxt.m.b8[12];
	ctxt->m.b8[16] = tctxt.m.b8[19]; ctxt->m.b8[17] = tctxt.m.b8[18];
	ctxt->m.b8[18] = tctxt.m.b8[17]; ctxt->m.b8[19] = tctxt.m.b8[16];
	ctxt->m.b8[20] = tctxt.m.b8[23]; ctxt->m.b8[21] = tctxt.m.b8[22];
	ctxt->m.b8[22] = tctxt.m.b8[21]; ctxt->m.b8[23] = tctxt.m.b8[20];
	ctxt->m.b8[24] = tctxt.m.b8[27]; ctxt->m.b8[25] = tctxt.m.b8[26];
	ctxt->m.b8[26] = tctxt.m.b8[25]; ctxt->m.b8[27] = tctxt.m.b8[24];
	ctxt->m.b8[28] = tctxt.m.b8[31]; ctxt->m.b8[29] = tctxt.m.b8[30];
	ctxt->m.b8[30] = tctxt.m.b8[29]; ctxt->m.b8[31] = tctxt.m.b8[28];
	ctxt->m.b8[32] = tctxt.m.b8[35]; ctxt->m.b8[33] = tctxt.m.b8[34];
	ctxt->m.b8[34] = tctxt.m.b8[33]; ctxt->m.b8[35] = tctxt.m.b8[32];
	ctxt->m.b8[36] = tctxt.m.b8[39]; ctxt->m.b8[37] = tctxt.m.b8[38];
	ctxt->m.b8[38] = tctxt.m.b8[37]; ctxt->m.b8[39] = tctxt.m.b8[36];
	ctxt->m.b8[40] = tctxt.m.b8[43]; ctxt->m.b8[41] = tctxt.m.b8[42];
	ctxt->m.b8[42] = tctxt.m.b8[41]; ctxt->m.b8[43] = tctxt.m.b8[40];
	ctxt->m.b8[44] = tctxt.m.b8[47]; ctxt->m.b8[45] = tctxt.m.b8[46];
	ctxt->m.b8[46] = tctxt.m.b8[45]; ctxt->m.b8[47] = tctxt.m.b8[44];
	ctxt->m.b8[48] = tctxt.m.b8[51]; ctxt->m.b8[49] = tctxt.m.b8[50];
	ctxt->m.b8[50] = tctxt.m.b8[49]; ctxt->m.b8[51] = tctxt.m.b8[48];
	ctxt->m.b8[52] = tctxt.m.b8[55]; ctxt->m.b8[53] = tctxt.m.b8[54];
	ctxt->m.b8[54] = tctxt.m.b8[53]; ctxt->m.b8[55] = tctxt.m.b8[52];
	ctxt->m.b8[56] = tctxt.m.b8[59]; ctxt->m.b8[57] = tctxt.m.b8[58];
	ctxt->m.b8[58] = tctxt.m.b8[57]; ctxt->m.b8[59] = tctxt.m.b8[56];
	ctxt->m.b8[60] = tctxt.m.b8[63]; ctxt->m.b8[61] = tctxt.m.b8[62];
	ctxt->m.b8[62] = tctxt.m.b8[61]; ctxt->m.b8[63] = tctxt.m.b8[60];
#endif

	a = H(0); b = H(1); c = H(2); d = H(3); e = H(4);

	for (t = 0; t < 20; t++) {
		s = t & 0x0f;
		if (t >= 16)
			W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));

		tmp = S(5, a) + F0(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 20; t < 40; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F1(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 40; t < 60; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F2(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 60; t < 80; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F3(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}

	H(0) = H(0) + a;
	H(1) = H(1) + b;
	H(2) = H(2) + c;
	H(3) = H(3) + d;
	H(4) = H(4) + e;

	memset(&ctxt->m.b8[0], 0, 64);
}